

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void attachFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  byte bVar1;
  sqlite3 *db;
  Db *pDVar2;
  Pager *pPVar3;
  Btree *pBVar4;
  char *pcVar5;
  Btree *pBVar6;
  Schema *pSVar7;
  u8 uVar8;
  undefined6 uVar9;
  u8 uVar10;
  u8 uVar11;
  undefined6 uVar12;
  Btree **ppBVar13;
  int iVar14;
  int iVar15;
  byte *zUri;
  byte *__src;
  Db *pDVar16;
  Schema *pSVar17;
  char *pcVar18;
  long lVar19;
  undefined4 uVar20;
  Mem *pMem;
  byte *pbVar21;
  byte *pbVar22;
  uint n;
  char *zErrDyn;
  uint flags;
  char *zPath;
  char *zErr;
  sqlite3_vfs *pVfs;
  char *local_68;
  Btree **local_60;
  uint local_54;
  Mem *local_50;
  char *local_48;
  char *local_40;
  sqlite3_vfs *local_38;
  
  pMem = &context->s;
  db = (context->s).db;
  iVar15 = 0;
  local_48 = (char *)0x0;
  local_40 = (char *)0x0;
  local_68 = (char *)0x0;
  zUri = (byte *)sqlite3ValueText(*argv,'\x01');
  __src = (byte *)sqlite3ValueText(argv[1],'\x01');
  if (zUri == (byte *)0x0) {
    zUri = (byte *)0x1ad663;
  }
  if (__src == (byte *)0x0) {
    __src = (byte *)0x1ad663;
  }
  if (db->nDb < db->aLimit[7] + 2) {
    if (db->autoCommit == '\0') {
      iVar15 = 0;
      local_68 = sqlite3MPrintf(db,"cannot ATTACH database within transaction");
    }
    else {
      iVar15 = db->nDb;
      if (0 < (long)iVar15) {
        lVar19 = 0;
        do {
          pbVar22 = (byte *)db->aDb[lVar19].zName;
          bVar1 = *pbVar22;
          pbVar21 = __src;
          while ((bVar1 != 0 && (pbVar22 = pbVar22 + 1, ""[bVar1] == ""[*pbVar21]))) {
            pbVar21 = pbVar21 + 1;
            bVar1 = *pbVar22;
          }
          if (""[bVar1] == ""[*pbVar21]) {
            pcVar18 = "database %s is already in use";
            iVar15 = 0;
            goto LAB_0019efbb;
          }
          lVar19 = lVar19 + 1;
        } while (lVar19 != iVar15);
      }
      local_50 = pMem;
      if (db->aDb == db->aDbStatic) {
        pDVar16 = (Db *)sqlite3DbMallocRaw(db,0x60);
        if (pDVar16 == (Db *)0x0) {
          return;
        }
        pDVar2 = db->aDb;
        pcVar18 = pDVar2->zName;
        pBVar4 = pDVar2->pBt;
        uVar10 = pDVar2->inTrans;
        uVar11 = pDVar2->safety_level;
        uVar12 = *(undefined6 *)&pDVar2->field_0x12;
        pSVar17 = pDVar2->pSchema;
        pcVar5 = pDVar2[1].zName;
        pBVar6 = pDVar2[1].pBt;
        uVar8 = pDVar2[1].safety_level;
        uVar9 = *(undefined6 *)&pDVar2[1].field_0x12;
        pSVar7 = pDVar2[1].pSchema;
        pDVar16[1].inTrans = pDVar2[1].inTrans;
        pDVar16[1].safety_level = uVar8;
        *(undefined6 *)&pDVar16[1].field_0x12 = uVar9;
        pDVar16[1].pSchema = pSVar7;
        pDVar16[1].zName = pcVar5;
        pDVar16[1].pBt = pBVar6;
        pDVar16->inTrans = uVar10;
        pDVar16->safety_level = uVar11;
        *(undefined6 *)&pDVar16->field_0x12 = uVar12;
        pDVar16->pSchema = pSVar17;
        pDVar16->zName = pcVar18;
        pDVar16->pBt = pBVar4;
      }
      else {
        pDVar16 = (Db *)sqlite3DbRealloc(db,db->aDb,iVar15 * 0x20 + 0x20);
        if (pDVar16 == (Db *)0x0) {
          return;
        }
      }
      db->aDb = pDVar16;
      iVar15 = db->nDb;
      pDVar2 = pDVar16 + iVar15;
      pDVar2->inTrans = '\0';
      pDVar2->safety_level = '\0';
      *(undefined6 *)&pDVar2->field_0x12 = 0;
      *(Schema **)(&pDVar2->inTrans + 8) = (Schema *)0x0;
      pDVar16[iVar15].zName = (char *)0x0;
      pDVar16[iVar15].pBt = (Btree *)0x0;
      local_54 = db->openFlags;
      iVar14 = sqlite3ParseUri(db->pVfs->zName,(char *)zUri,&local_54,&local_38,&local_48,&local_40)
      ;
      pcVar18 = local_40;
      if (iVar14 != 0) {
        if (iVar14 == 7) {
          db->mallocFailed = '\x01';
        }
        context->isError = 1;
        sqlite3VdbeMemSetStr(local_50,local_40,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
        sqlite3_free(pcVar18);
        return;
      }
      pDVar16 = pDVar16 + iVar15;
      local_54 = local_54 | 0x100;
      local_60 = &pDVar16->pBt;
      iVar15 = sqlite3BtreeOpen(local_38,local_48,db,local_60,0,local_54);
      sqlite3_free(local_48);
      ppBVar13 = local_60;
      db->nDb = db->nDb + 1;
      if (iVar15 == 0) {
        pSVar17 = sqlite3SchemaGet(db,pDVar16->pBt);
        pDVar16->pSchema = pSVar17;
        if (pSVar17 == (Schema *)0x0) {
          uVar20 = 7;
        }
        else {
          uVar20 = 0;
          if ((pSVar17->file_format != '\0') && (pSVar17->enc != db->aDb->pSchema->enc)) {
            local_68 = sqlite3MPrintf(db,
                                      "attached databases must use the same text encoding as main database"
                                     );
            uVar20 = 1;
          }
        }
        local_60 = (Btree **)CONCAT44(local_60._4_4_,uVar20);
        pBVar4 = *ppBVar13;
        pPVar3 = pBVar4->pBt->pPager;
        if (pPVar3->tempFile == '\0') {
          if ((pPVar3->pWal == (Wal *)0x0) || (pPVar3->pWal->exclusiveMode != '\x02')) {
            pPVar3->exclusiveMode = db->dfltLockMode;
          }
        }
        iVar15 = sqlite3BtreeSecureDelete(db->aDb->pBt,-1);
        sqlite3BtreeSecureDelete(pBVar4,iVar15);
        iVar15 = (int)local_60;
      }
      else if (iVar15 == 0x13) {
        local_68 = sqlite3MPrintf(db,"database is already attached");
        iVar15 = 1;
      }
      local_60 = (Btree **)CONCAT44(local_60._4_4_,iVar15);
      pDVar16->safety_level = '\x03';
      lVar19 = 0;
      do {
        pbVar22 = __src + lVar19;
        lVar19 = lVar19 + 1;
      } while (*pbVar22 != 0);
      n = ((int)lVar19 - 1U & 0x3fffffff) + 1;
      pcVar18 = (char *)sqlite3DbMallocRaw(db,n);
      if (pcVar18 == (char *)0x0) {
        iVar15 = 7;
      }
      else {
        memcpy(pcVar18,__src,(ulong)n);
        iVar15 = 0;
      }
      pDVar16->zName = pcVar18;
      if ((int)local_60 != 0) {
        iVar15 = (int)local_60;
      }
      if (iVar15 == 0) {
        sqlite3BtreeEnterAll(db);
        iVar15 = sqlite3Init(db,&local_68);
        sqlite3BtreeLeaveAll(db);
      }
      if (iVar15 == 0) {
        return;
      }
      lVar19 = (long)db->nDb + -1;
      pBVar4 = db->aDb[lVar19].pBt;
      if (pBVar4 != (Btree *)0x0) {
        sqlite3BtreeClose(pBVar4);
        pDVar16 = db->aDb;
        pDVar16[lVar19].pBt = (Btree *)0x0;
        pDVar16[lVar19].pSchema = (Schema *)0x0;
      }
      sqlite3ResetAllSchemasOfConnection(db);
      db->nDb = (int)lVar19;
      if ((iVar15 == 0xc0a) || (iVar15 == 7)) {
        db->mallocFailed = '\x01';
        sqlite3DbFree(db,local_68);
        local_68 = sqlite3MPrintf(db,"out of memory");
        pMem = local_50;
      }
      else {
        pMem = local_50;
        if (local_68 == (char *)0x0) {
          pcVar18 = "unable to open database: %s";
          __src = zUri;
LAB_0019efbb:
          local_68 = sqlite3MPrintf(db,pcVar18,__src);
        }
      }
    }
  }
  else {
    local_68 = sqlite3MPrintf(db,"too many attached databases - max %d");
  }
  if (local_68 != (char *)0x0) {
    context->isError = 1;
    sqlite3VdbeMemSetStr(pMem,local_68,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
    sqlite3DbFree(db,local_68);
  }
  if (iVar15 != 0) {
    sqlite3_result_error_code(context,iVar15);
  }
  return;
}

Assistant:

static void attachFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  int i;
  int rc = 0;
  sqlite3 *db = sqlite3_context_db_handle(context);
  const char *zName;
  const char *zFile;
  char *zPath = 0;
  char *zErr = 0;
  unsigned int flags;
  Db *aNew;
  char *zErrDyn = 0;
  sqlite3_vfs *pVfs;

  UNUSED_PARAMETER(NotUsed);

  zFile = (const char *)sqlite3_value_text(argv[0]);
  zName = (const char *)sqlite3_value_text(argv[1]);
  if( zFile==0 ) zFile = "";
  if( zName==0 ) zName = "";

  /* Check for the following errors:
  **
  **     * Too many attached databases,
  **     * Transaction currently open
  **     * Specified database name already being used.
  */
  if( db->nDb>=db->aLimit[SQLITE_LIMIT_ATTACHED]+2 ){
    zErrDyn = sqlite3MPrintf(db, "too many attached databases - max %d", 
      db->aLimit[SQLITE_LIMIT_ATTACHED]
    );
    goto attach_error;
  }
  if( !db->autoCommit ){
    zErrDyn = sqlite3MPrintf(db, "cannot ATTACH database within transaction");
    goto attach_error;
  }
  for(i=0; i<db->nDb; i++){
    char *z = db->aDb[i].zName;
    assert( z && zName );
    if( sqlite3StrICmp(z, zName)==0 ){
      zErrDyn = sqlite3MPrintf(db, "database %s is already in use", zName);
      goto attach_error;
    }
  }

  /* Allocate the new entry in the db->aDb[] array and initialize the schema
  ** hash tables.
  */
  if( db->aDb==db->aDbStatic ){
    aNew = sqlite3DbMallocRaw(db, sizeof(db->aDb[0])*3 );
    if( aNew==0 ) return;
    memcpy(aNew, db->aDb, sizeof(db->aDb[0])*2);
  }else{
    aNew = sqlite3DbRealloc(db, db->aDb, sizeof(db->aDb[0])*(db->nDb+1) );
    if( aNew==0 ) return;
  }
  db->aDb = aNew;
  aNew = &db->aDb[db->nDb];
  memset(aNew, 0, sizeof(*aNew));

  /* Open the database file. If the btree is successfully opened, use
  ** it to obtain the database schema. At this point the schema may
  ** or may not be initialized.
  */
  flags = db->openFlags;
  rc = sqlite3ParseUri(db->pVfs->zName, zFile, &flags, &pVfs, &zPath, &zErr);
  if( rc!=SQLITE_OK ){
    if( rc==SQLITE_NOMEM ) db->mallocFailed = 1;
    sqlite3_result_error(context, zErr, -1);
    sqlite3_free(zErr);
    return;
  }
  assert( pVfs );
  flags |= SQLITE_OPEN_MAIN_DB;
  rc = sqlite3BtreeOpen(pVfs, zPath, db, &aNew->pBt, 0, flags);
  sqlite3_free( zPath );
  db->nDb++;
  if( rc==SQLITE_CONSTRAINT ){
    rc = SQLITE_ERROR;
    zErrDyn = sqlite3MPrintf(db, "database is already attached");
  }else if( rc==SQLITE_OK ){
    Pager *pPager;
    aNew->pSchema = sqlite3SchemaGet(db, aNew->pBt);
    if( !aNew->pSchema ){
      rc = SQLITE_NOMEM;
    }else if( aNew->pSchema->file_format && aNew->pSchema->enc!=ENC(db) ){
      zErrDyn = sqlite3MPrintf(db, 
        "attached databases must use the same text encoding as main database");
      rc = SQLITE_ERROR;
    }
    pPager = sqlite3BtreePager(aNew->pBt);
    sqlite3PagerLockingMode(pPager, db->dfltLockMode);
    sqlite3BtreeSecureDelete(aNew->pBt,
                             sqlite3BtreeSecureDelete(db->aDb[0].pBt,-1) );
  }
  aNew->safety_level = 3;
  aNew->zName = sqlite3DbStrDup(db, zName);
  if( rc==SQLITE_OK && aNew->zName==0 ){
    rc = SQLITE_NOMEM;
  }


#ifdef SQLITE_HAS_CODEC
  if( rc==SQLITE_OK ){
    extern int sqlite3CodecAttach(sqlite3*, int, const void*, int);
    extern void sqlite3CodecGetKey(sqlite3*, int, void**, int*);
    int nKey;
    char *zKey;
    int t = sqlite3_value_type(argv[2]);
    switch( t ){
      case SQLITE_INTEGER:
      case SQLITE_FLOAT:
        zErrDyn = sqlite3DbStrDup(db, "Invalid key value");
        rc = SQLITE_ERROR;
        break;
        
      case SQLITE_TEXT:
      case SQLITE_BLOB:
        nKey = sqlite3_value_bytes(argv[2]);
        zKey = (char *)sqlite3_value_blob(argv[2]);
        rc = sqlite3CodecAttach(db, db->nDb-1, zKey, nKey);
        break;

      case SQLITE_NULL:
        /* No key specified.  Use the key from the main database */
        sqlite3CodecGetKey(db, 0, (void**)&zKey, &nKey);
        if( nKey>0 || sqlite3BtreeGetReserve(db->aDb[0].pBt)>0 ){
          rc = sqlite3CodecAttach(db, db->nDb-1, zKey, nKey);
        }
        break;
    }
  }
#endif

  /* If the file was opened successfully, read the schema for the new database.
  ** If this fails, or if opening the file failed, then close the file and 
  ** remove the entry from the db->aDb[] array. i.e. put everything back the way
  ** we found it.
  */
  if( rc==SQLITE_OK ){
    sqlite3BtreeEnterAll(db);
    rc = sqlite3Init(db, &zErrDyn);
    sqlite3BtreeLeaveAll(db);
  }
  if( rc ){
    int iDb = db->nDb - 1;
    assert( iDb>=2 );
    if( db->aDb[iDb].pBt ){
      sqlite3BtreeClose(db->aDb[iDb].pBt);
      db->aDb[iDb].pBt = 0;
      db->aDb[iDb].pSchema = 0;
    }
    sqlite3ResetAllSchemasOfConnection(db);
    db->nDb = iDb;
    if( rc==SQLITE_NOMEM || rc==SQLITE_IOERR_NOMEM ){
      db->mallocFailed = 1;
      sqlite3DbFree(db, zErrDyn);
      zErrDyn = sqlite3MPrintf(db, "out of memory");
    }else if( zErrDyn==0 ){
      zErrDyn = sqlite3MPrintf(db, "unable to open database: %s", zFile);
    }
    goto attach_error;
  }
  
  return;

attach_error:
  /* Return an error if we get here */
  if( zErrDyn ){
    sqlite3_result_error(context, zErrDyn, -1);
    sqlite3DbFree(db, zErrDyn);
  }
  if( rc ) sqlite3_result_error_code(context, rc);
}